

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O0

void duckdb::InitializeUpdateData<duckdb::interval_t>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,SelectionVector *sel)

{
  uint uVar1;
  int32_t iVar2;
  bool bVar3;
  interval_t *piVar4;
  interval_t *piVar5;
  idx_t iVar6;
  interval_t *piVar7;
  sel_t *psVar8;
  UnifiedVectorFormat *in_RCX;
  interval_t *piVar9;
  long in_RDX;
  undefined8 *in_RDI;
  SelectionVector *in_R8;
  interval_t iVar10;
  sel_t base_idx;
  idx_t i_1;
  sel_t *base_tuples;
  interval_t *base_tuple_data;
  ValidityMask *base_validity;
  interval_t *base_array_data;
  idx_t idx;
  idx_t i;
  interval_t *tuple_data;
  interval_t *update_data;
  SelectionVector *in_stack_ffffffffffffff60;
  UpdateSegment *in_stack_ffffffffffffff68;
  undefined8 local_88;
  int64_t local_80;
  ulong local_70;
  ulong local_40;
  
  piVar4 = UnifiedVectorFormat::GetData<duckdb::interval_t>(in_RCX);
  piVar5 = UpdateInfo::GetData<duckdb::interval_t>((UpdateInfo *)0xbc3e6e);
  for (local_40 = 0; local_40 < *(uint *)(in_RDX + 0x20); local_40 = local_40 + 1) {
    in_stack_ffffffffffffff60 = in_RCX->sel;
    iVar6 = SelectionVector::get_index(in_R8,local_40);
    iVar6 = SelectionVector::get_index(in_stack_ffffffffffffff60,iVar6);
    piVar9 = piVar4 + iVar6;
    piVar7 = piVar5 + local_40;
    iVar2 = piVar9->days;
    piVar7->months = piVar9->months;
    piVar7->days = iVar2;
    piVar7->micros = piVar9->micros;
  }
  piVar4 = FlatVector::GetData<duckdb::interval_t>((Vector *)0xbc3f15);
  FlatVector::Validity((Vector *)0xbc3f27);
  piVar5 = UpdateInfo::GetData<duckdb::interval_t>((UpdateInfo *)0xbc3f39);
  psVar8 = UpdateInfo::GetTuples((UpdateInfo *)0xbc3f4b);
  for (local_70 = 0; local_70 < *(uint *)(in_RDI + 4); local_70 = local_70 + 1) {
    uVar1 = psVar8[local_70];
    bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffff68,
                       (idx_t)in_stack_ffffffffffffff60);
    if (bVar3) {
      in_stack_ffffffffffffff68 = *(UpdateSegment **)(piVar4 + uVar1);
      iVar10.micros = (int64_t)in_stack_ffffffffffffff68;
      iVar10._0_8_ = piVar4[uVar1].micros;
      iVar10 = UpdateSelectElement::Operation<duckdb::interval_t>
                         ((UpdateSelectElement *)*in_RDI,in_stack_ffffffffffffff68,iVar10);
      piVar7 = piVar5 + local_70;
      local_88 = iVar10._0_8_;
      piVar7->months = (undefined4)local_88;
      piVar7->days = local_88._4_4_;
      local_80 = iVar10.micros;
      piVar7->micros = local_80;
    }
  }
  return;
}

Assistant:

static void InitializeUpdateData(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                                 UnifiedVectorFormat &update, const SelectionVector &sel) {
	auto update_data = update.GetData<T>(update);
	auto tuple_data = update_info.GetData<T>();

	for (idx_t i = 0; i < update_info.N; i++) {
		auto idx = update.sel->get_index(sel.get_index(i));
		tuple_data[i] = update_data[idx];
	}

	auto base_array_data = FlatVector::GetData<T>(base_data);
	auto &base_validity = FlatVector::Validity(base_data);
	auto base_tuple_data = base_info.GetData<T>();
	auto base_tuples = base_info.GetTuples();
	for (idx_t i = 0; i < base_info.N; i++) {
		auto base_idx = base_tuples[i];
		if (!base_validity.RowIsValid(base_idx)) {
			continue;
		}
		base_tuple_data[i] = UpdateSelectElement::Operation<T>(*base_info.segment, base_array_data[base_idx]);
	}
}